

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * curve_new(t_symbol *classsym,int argc,t_atom *argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  t_pd *object;
  _glist *p_Var4;
  ulong uVar5;
  t_pd fd;
  uint uVar6;
  char *flag;
  ulong uVar7;
  t_atom *argv_00;
  uint uVar8;
  bool bVar9;
  
  object = pd_new(curve_class);
  pcVar1 = classsym->s_name;
  p_Var4 = canvas_getcurrent();
  object[0x1d] = (t_pd)p_Var4;
  bVar9 = *pcVar1 == 'f';
  uVar5 = (ulong)bVar9;
  uVar7 = (ulong)(bVar9 + 2);
  if (pcVar1[uVar5 * 2 + 4] != 'c') {
    uVar7 = uVar5;
  }
  *(undefined2 *)(object + 0x16) = 1;
  *(undefined4 *)(object + 0x17) = 0x3f800000;
  object[0x18] = (t_pd)0x0;
  object[0x19] = (t_pd)0x0;
  *(undefined4 *)(object + 0x1a) = 0;
  while (((uVar8 = (uint)uVar7, argc != 0 && (argv->a_type == A_SYMBOL)) &&
         (pcVar1 = ((argv->a_w).w_symbol)->s_name, *pcVar1 == '-'))) {
    if ((pcVar1[1] == 'n') && (pcVar1[2] == '\0')) {
      *(undefined2 *)(object + 0x16) = 1;
      *(undefined4 *)(object + 0x17) = 0;
      object[0x18] = (t_pd)0x0;
      object[0x19] = (t_pd)0x0;
      *(undefined4 *)(object + 0x1a) = 0;
    }
    else if ((pcVar1[1] == 'v') && ((1 < argc && (pcVar1[2] == '\0')))) {
      argv = argv + 1;
      fielddesc_setfloatarg((_fielddesc *)(object + 0x16),1,argv);
      argc = argc + -1;
    }
    else if ((pcVar1[1] == 'x') && (pcVar1[2] == '\0')) {
      uVar7 = (ulong)(uVar8 | 0xc);
    }
    else {
      iVar2 = strcmp(pcVar1,"-xr");
      if (iVar2 == 0) {
        uVar7 = (ulong)(uVar8 | 4);
      }
      else {
        iVar2 = strcmp(pcVar1,"-xe");
        if (iVar2 == 0) {
          uVar7 = (ulong)(uVar8 | 8);
        }
        else {
          iVar2 = strcmp(pcVar1,"-xv");
          if (iVar2 == 0) {
            uVar7 = (ulong)(uVar8 | 0x10);
          }
          else {
            pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,pcVar1);
          }
        }
      }
    }
    argc = argc + -1;
    argv = argv + 1;
  }
  *(uint *)(object + 6) = uVar8;
  if ((uVar7 & 1) == 0 || argc == 0) {
    *(undefined2 *)(object + 7) = 1;
    *(undefined4 *)(object + 8) = 0;
    object[9] = (t_pd)0x0;
    object[10] = (t_pd)0x0;
    *(undefined4 *)(object + 0xb) = 0;
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 7),argc,argv);
    argv = argv + 1;
    argc = argc + -1;
  }
  if (argc == 0) {
    *(undefined2 *)(object + 0xc) = 1;
    *(undefined4 *)(object + 0xd) = 0;
    object[0xe] = (t_pd)0x0;
    object[0xf] = (t_pd)0x0;
    *(undefined4 *)(object + 0x10) = 0;
    argv_00 = argv;
  }
  else {
    argv_00 = argv + 1;
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argc,argv);
    if (argc + -1 != 0) {
      uVar8 = argc - 2;
      fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argc + -1,argv_00);
      argv_00 = argv + 2;
      goto LAB_001578e3;
    }
  }
  *(undefined2 *)(object + 0x11) = 1;
  *(undefined4 *)(object + 0x12) = 0x3f800000;
  object[0x13] = (t_pd)0x0;
  object[0x14] = (t_pd)0x0;
  *(undefined4 *)(object + 0x15) = 0;
  uVar8 = 0;
LAB_001578e3:
  uVar6 = 0;
  if (0 < (int)uVar8) {
    uVar6 = uVar8;
  }
  uVar8 = uVar6 & 1;
  uVar3 = uVar6 + (uVar6 & 1);
  *(uint *)(object + 0x1b) = uVar3 >> 1;
  fd = (t_pd)getbytes((ulong)uVar3 * 0x28);
  object[0x1c] = fd;
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    fielddesc_setfloatarg((_fielddesc *)fd,1,argv_00);
    fd = (t_pd)&fd->c_nmethod;
    argv_00 = argv_00 + 1;
  }
  if (uVar8 != 0) {
    *(undefined2 *)&fd->c_name = 1;
    *(undefined4 *)&fd->c_helpname = 0;
    fd->c_externdir = (t_symbol *)0x0;
    fd->c_size = 0;
    *(undefined4 *)&fd->c_methods = 0;
  }
  return object;
}

Assistant:

static void *curve_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_curve *x = (t_curve *)pd_new(curve_class);
    const char *classname = classsym->s_name;
    int flags = 0;
    int nxy, i;
    t_fielddesc *fd;
    x->x_canvas = canvas_getcurrent();
    if (classname[0] == 'f')
    {
        classname += 6;
        flags |= CLOSED;
    }
    else classname += 4;
    if (classname[0] == 'c') flags |= BEZ;
    fielddesc_setfloat_const(&x->x_vis, 1);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name;
        if (!strcmp(flag, "-n"))
        {
            fielddesc_setfloat_const(&x->x_vis, 0);
        }
        else if (!strcmp(flag, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "-x"))
        {
            /* disable all mouse interaction */
            flags |= (NOMOUSERUN | NOMOUSEEDIT);
        }
        else if (!strcmp(flag, "-xr"))
        {
            /* disable mouse actions in run mode */
            flags |= NOMOUSERUN;
        }
        else if (!strcmp(flag, "-xe"))
        {
            /* disable mouse actions in edit mode */
            flags |= NOMOUSEEDIT;
        }
        else if (!strcmp(flag, "-xv"))
        {
            /* disable changing vertices in run mode */
            flags |= NOVERTICES;
        }
        else
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                flag);
        }
        argc--; argv++;
    }
    x->x_flags = flags;
    if ((flags & CLOSED) && argc)
        fielddesc_setfloatarg(&x->x_fillcolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_fillcolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc < 0) argc = 0;
    nxy =  (argc + (argc & 1));
    x->x_npoints = (nxy>>1);
    x->x_vec = (t_fielddesc *)t_getbytes(nxy * sizeof(t_fielddesc));
    for (i = 0, fd = x->x_vec; i < argc; i++, fd++, argv++)
        fielddesc_setfloatarg(fd, 1, argv);
    if (argc & 1) fielddesc_setfloat_const(fd, 0);

    return (x);
}